

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::ExceptionOr<kj::OwnFd>::~ExceptionOr(ExceptionOr<kj::OwnFd> *this)

{
  ExceptionOr<kj::OwnFd> *this_local;
  
  Maybe<kj::OwnFd>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}